

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_socket.c
# Opt level: O2

int log_policy_stream_socket_create(log_policy policy,log_policy_ctor ctor)

{
  undefined8 *instance;
  
  instance = (undefined8 *)malloc(8);
  if (instance != (undefined8 *)0x0) {
    *instance = ctor;
    log_policy_instantiate(policy,instance,2);
  }
  return (uint)(instance == (undefined8 *)0x0);
}

Assistant:

static int log_policy_stream_socket_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_stream_socket_data socket_data = malloc(sizeof(struct log_policy_stream_socket_data_type));

	const log_policy_stream_socket_ctor socket_ctor = ctor;

	if (socket_data == NULL)
	{
		return 1;
	}

/* TODO: open socket */
#define socket_open(ip, port) /* NULL */ (void *)socket_ctor

	socket_data->socket = socket_open(socket_ctor->ip, socket_ctor->port);

	log_policy_instantiate(policy, socket_data, LOG_POLICY_STREAM_SOCKET);

	return 0;
}